

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O2

void set_player_palette(dw_rom *rom,uint8_t palette)

{
  byte bVar1;
  uint16_t base;
  ulong uVar2;
  
  for (_base = 0x13b5; _base < 0x16b6; _base = _base + 0x100) {
    for (uVar2 = _base; uVar2 <= _base + 0x4e; uVar2 = uVar2 + 2) {
      bVar1 = rom->content[uVar2];
      if ((bVar1 & 3) == 0) {
        rom->content[uVar2] = bVar1 | palette;
      }
    }
  }
  return;
}

Assistant:

static void set_player_palette(dw_rom *rom, uint8_t palette)
{
    uint16_t base, address;

    if (palette > 3) {
        printf("Improper palette number of %d, ignoring.\n", palette);
        return;
    }
    for (base = 0x13b5; base <= 0x16b5; base += 0x100) {
        for (address = base; address <= base + 0x4e; address += 2) {
            if (!(rom->content[address] & 0x03))
                rom->content[address] |= palette;
        }
    }
}